

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_5::writeTileData
               (OutputStreamMutex *streamData,Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,
               int pixelDataSize)

{
  int iVar1;
  uint64_t *puVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  TileOffsets *in_RDI;
  undefined8 in_stack_00000008;
  uint64_t currentPosition;
  undefined8 in_stack_ffffffffffffffc8;
  OStream *out;
  OStream *local_28;
  
  local_28 = *(OStream **)&in_RDI[1]._numYLevels;
  *(undefined8 *)&in_RDI[1]._numYLevels = 0;
  if (local_28 == (OStream *)0x0) {
    local_28 = (OStream *)(**(code **)(**(long **)(in_RDI + 1) + 0x18))();
  }
  out = local_28;
  puVar2 = TileOffsets::operator()(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX,in_ECX);
  *puVar2 = (uint64_t)out;
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if ((*(byte *)(in_RSI + 0x3c) & 1) != 0) {
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,iVar1);
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,iVar1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,iVar1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,iVar1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,iVar1);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(out,iVar1);
  (**(code **)(**(long **)(in_RDI + 1) + 0x10))
            (*(long **)(in_RDI + 1),in_stack_00000008,(int)currentPosition);
  iVar1 = Xdr::size<int>();
  *(long *)&in_RDI[1]._numYLevels =
       (long)&local_28->_vptr_OStream + (long)(int)currentPosition + (long)(iVar1 * 5);
  if ((*(byte *)(in_RSI + 0x3c) & 1) != 0) {
    iVar1 = Xdr::size<int>();
    *(long *)&in_RDI[1]._numYLevels = (long)iVar1 + *(long *)&in_RDI[1]._numYLevels;
  }
  return;
}

Assistant:

void
writeTileData (
    OutputStreamMutex*     streamData,
    TiledOutputFile::Data* ofd,
    int                    dx,
    int                    dy,
    int                    lx,
    int                    ly,
    const char             pixelData[],
    int                    pixelDataSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    uint64_t currentPosition    = streamData->currentPosition;
    streamData->currentPosition = 0;

    if (currentPosition == 0) currentPosition = streamData->os->tellp ();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

#ifdef DEBUG
    assert (streamData->os->tellp () == currentPosition);
#endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write<StreamIO> (*streamData->os, ofd->partNumber);
    }
    Xdr::write<StreamIO> (*streamData->os, dx);
    Xdr::write<StreamIO> (*streamData->os, dy);
    Xdr::write<StreamIO> (*streamData->os, lx);
    Xdr::write<StreamIO> (*streamData->os, ly);
    Xdr::write<StreamIO> (*streamData->os, pixelDataSize);

    streamData->os->write (pixelData, pixelDataSize);

    //
    // Keep current position in the file so that we can avoid
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    streamData->currentPosition =
        currentPosition + 5 * Xdr::size<int> () + pixelDataSize;

    if (ofd->multipart) { streamData->currentPosition += Xdr::size<int> (); }
}